

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O0

void __thiscall Chip8::OP_DXYN(Chip8 *this)

{
  byte bVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint local_20;
  uint local_1c;
  uint x;
  uint y;
  uint8_t pixel;
  uint8_t h;
  uint8_t yPos;
  uint8_t xPos;
  uint8_t Vy;
  uint8_t Vx;
  Chip8 *this_local;
  
  uVar3 = (uint)this->registers[(this->opcode & 0xf00) >> 8] % this->VIDEO_WIDTH;
  uVar4 = (uint)this->registers[(this->opcode & 0xf0) >> 4] % this->VIDEO_HEIGHT;
  uVar2 = this->opcode;
  this->registers[0xf] = '\0';
  for (local_1c = 0; local_1c < ((byte)uVar2 & 0xf); local_1c = local_1c + 1) {
    bVar1 = this->memory[this->index + local_1c];
    for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
      if (((uint)bVar1 & 0x80U >> ((byte)local_20 & 0x1f)) != 0) {
        if (this->display
            [(uVar3 & 0xff) + local_20 + this->VIDEO_WIDTH * ((uVar4 & 0xff) + local_1c)] ==
            0xffffffff) {
          this->registers[0xf] = '\x01';
        }
        uVar5 = (uVar3 & 0xff) + local_20 + this->VIDEO_WIDTH * ((uVar4 & 0xff) + local_1c);
        this->display[uVar5] = this->display[uVar5] ^ 0xffffffff;
      }
    }
  }
  return;
}

Assistant:

void Chip8::OP_DXYN() {
    uint8_t Vx = registers[(opcode & 0x0F00u) >> 8u];
    uint8_t Vy = registers[(opcode & 0x00F0u) >> 4u];
    uint8_t xPos = Vx % VIDEO_WIDTH;
    uint8_t yPos = Vy % VIDEO_HEIGHT;
    uint8_t h = (opcode & 0x000Fu);
    uint8_t pixel;
    registers[0xF] = 0;

    for(unsigned int y = 0; y < h; y++){
        pixel = memory[index + y];
        for(unsigned int x = 0; x < 8; x++){
            if(pixel & (0x80u >> x)){
                if(display[(xPos + x) + VIDEO_WIDTH*(yPos + y)] == 0xFFFFFFFF)
                    registers[0xF] = 1;
                display[(xPos + x) + VIDEO_WIDTH*(yPos + y)] ^= 0xFFFFFFFF;
            }
        }
    }




}